

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFGdbIndex.cpp
# Opt level: O3

void __thiscall llvm::DWARFGdbIndex::dumpAddressArea(DWARFGdbIndex *this,raw_ostream *OS)

{
  char *__n;
  void *pvVar1;
  raw_ostream *this_00;
  ulong uVar2;
  void *__buf;
  long lVar3;
  format_object_base local_60;
  ulong local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_50 = (ulong)(this->AddressArea).super_SmallVectorImpl<llvm::DWARFGdbIndex::AddressEntry>.
                    super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::AddressEntry,_true>.
                    super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void>.
                    super_SmallVectorBase.Size;
  local_60.Fmt = "\n  Address area offset = 0x%x, has %ld entries:";
  local_60._vptr_format_object_base = (_func_int **)&PTR_home_01078068;
  local_48 = CONCAT44(local_48._4_4_,this->AddressAreaOffset);
  this_00 = raw_ostream::operator<<(OS,&local_60);
  __n = this_00->OutBufCur;
  if (__n < this_00->OutBufEnd) {
    this_00->OutBufCur = __n + 1;
    *__n = '\n';
  }
  else {
    raw_ostream::write(this_00,10,__buf,(size_t)__n);
  }
  uVar2 = (ulong)(this->AddressArea).super_SmallVectorImpl<llvm::DWARFGdbIndex::AddressEntry>.
                 super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::AddressEntry,_true>.
                 super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void>.
                 super_SmallVectorBase.Size;
  if (uVar2 != 0) {
    pvVar1 = (this->AddressArea).super_SmallVectorImpl<llvm::DWARFGdbIndex::AddressEntry>.
             super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::AddressEntry,_true>.
             super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void>.
             super_SmallVectorBase.BeginX;
    lVar3 = 0;
    do {
      local_38 = *(long *)((long)pvVar1 + lVar3);
      local_40 = *(long *)((long)pvVar1 + lVar3 + 8);
      local_48 = local_40 - local_38;
      local_60.Fmt = "    Low/High address = [0x%llx, 0x%llx) (Size: 0x%llx), CU id = %d\n";
      local_60._vptr_format_object_base = (_func_int **)&PTR_home_010789e0;
      local_50 = CONCAT44(local_50._4_4_,*(undefined4 *)((long)pvVar1 + lVar3 + 0x10));
      raw_ostream::operator<<(OS,&local_60);
      lVar3 = lVar3 + 0x18;
    } while (uVar2 * 0x18 != lVar3);
  }
  return;
}

Assistant:

void DWARFGdbIndex::dumpAddressArea(raw_ostream &OS) const {
  OS << format("\n  Address area offset = 0x%x, has %" PRId64 " entries:",
               AddressAreaOffset, (uint64_t)AddressArea.size())
     << '\n';
  for (const AddressEntry &Addr : AddressArea)
    OS << format(
        "    Low/High address = [0x%llx, 0x%llx) (Size: 0x%llx), CU id = %d\n",
        Addr.LowAddress, Addr.HighAddress, Addr.HighAddress - Addr.LowAddress,
        Addr.CuIndex);
}